

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

Result __thiscall tonk::gateway::SSDPRequester::InitializeSockets(SSDPRequester *this)

{
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  *this_00;
  io_context *owner;
  pointer __p;
  datagram_socket_service<asio::ip::udp> *pdVar1;
  StateMachine *pSVar2;
  in_addr_t *piVar3;
  undefined8 *puVar4;
  Result *success;
  int af;
  SSDPRequester *in_RSI;
  basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *pbVar5;
  long lVar6;
  undefined8 uVar7;
  error_code eVar8;
  error_code ec;
  address bindAddr;
  bad_address_cast ex;
  error_code local_a0;
  in_addr_t local_90;
  in_addr_t local_8c;
  address local_88;
  sockaddr local_64;
  undefined2 uStack_54;
  undefined2 uStack_52;
  undefined4 uStack_50;
  in_addr_t local_4c;
  undefined **local_48;
  long local_40;
  undefined8 local_38 [2];
  
  local_a0._M_value = 0;
  local_a0._M_cat = (error_category *)std::_V2::system_category();
  owner = (in_RSI->Host->Context)._M_t.
          super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
          super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
          super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
  __p = (pointer)operator_new(0x20,(nothrow_t *)&std::nothrow);
  if (__p != (pointer)0x0) {
    local_88._0_8_ =
         &asio::detail::typeid_wrapper<asio::datagram_socket_service<asio::ip::udp>>::typeinfo;
    local_88.ipv6_address_.addr_.__in6_u._0_8_ = (id *)0x0;
    pdVar1 = (datagram_socket_service<asio::ip::udp> *)
             asio::detail::service_registry::do_use_service
                       ((owner->super_execution_context).service_registry_,(key *)&local_88,
                        asio::detail::service_registry::
                        create<asio::datagram_socket_service<asio::ip::udp>,asio::io_context>,owner)
    ;
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.service_ = pdVar1;
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
    protocol_.family_ = 2;
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
    super_base_implementation_type.socket_ = -1;
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
    super_base_implementation_type.state_ = '\0';
  }
  this_00 = &in_RSI->Socket_UDP;
  std::
  __uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::reset((__uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           *)this_00,__p);
  pbVar5 = (in_RSI->Socket_UDP)._M_t.
           super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           .
           super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
           ._M_head_impl;
  if (pbVar5 == (basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                 *)0x0) {
    pSVar2 = (StateMachine *)operator_new(0x38);
    this->State = pSVar2;
    pSVar2->Host = (AsioHost *)"Out of memory";
    pSVar2->SSDP = (SSDPRequester *)((long)&(pSVar2->API_Lock).super___mutex_base._M_mutex + 8);
    (pSVar2->API_Lock).super___mutex_base._M_mutex.__align = 0;
    (pSVar2->API_Lock).super___mutex_base._M_mutex.__size[8] = '\0';
    *(undefined4 *)((long)&(pSVar2->API_Lock).super___mutex_base._M_mutex + 0x18) = 0;
    (pSVar2->API_Lock).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x10;
    return (Result)(ErrorResult *)this;
  }
  if ((in_RSI->State->InterfaceAddress)._M_string_length == 0) {
    af = 2;
    local_64.sa_family = 2;
    uStack_52 = 0;
    uStack_50 = 0;
    local_4c = 0;
    local_64.sa_data[2] = '\0';
    local_64.sa_data[3] = '\0';
    local_64.sa_data[4] = '\0';
    local_64.sa_data[5] = '\0';
    local_64.sa_data[6] = '\0';
    local_64.sa_data[7] = '\0';
    local_64.sa_data[8] = '\0';
    local_64.sa_data[9] = '\0';
    local_64.sa_data[10] = '\0';
    local_64.sa_data[0xb] = '\0';
    local_64.sa_data[0xc] = '\0';
    local_64.sa_data[0xd] = '\0';
    uStack_54 = 0;
  }
  else {
    asio::ip::make_address(&local_88,(in_RSI->State->InterfaceAddress)._M_dataplus._M_p,&local_a0);
    if (local_a0._M_value != 0) {
      (**(code **)(*(long *)local_a0._M_cat + 0x20))(&local_48);
      lVar6 = (long)local_a0._M_value;
      pSVar2 = (StateMachine *)operator_new(0x38);
      pSVar2->Host = (AsioHost *)"Provided InterfaceAddress was invalid";
      pSVar2->SSDP = (SSDPRequester *)((long)&(pSVar2->API_Lock).super___mutex_base._M_mutex + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pSVar2->SSDP,local_48,local_40 + (long)local_48);
      puVar4 = local_38;
      *(undefined4 *)((long)&(pSVar2->API_Lock).super___mutex_base._M_mutex + 0x18) = 2;
      *(long *)((long)&(pSVar2->API_Lock).super___mutex_base._M_mutex + 0x20) = lVar6;
      this->State = pSVar2;
      goto LAB_00158fbb;
    }
    local_8c = 0;
    local_90 = 0;
    if (local_88.type_ == ipv4) {
      uVar7 = (id *)0x0;
      local_88.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      piVar3 = &local_8c;
      local_64.sa_family = 2;
      af = 2;
      local_88.ipv6_address_.scope_id_._0_4_ = local_88.ipv4_address_.addr_.s_addr;
    }
    else {
      if (local_88.type_ != ipv6) {
        local_48 = &PTR__bad_cast_001cec88;
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = &PTR__bad_cast_001cec88;
        __cxa_throw(puVar4,&asio::ip::bad_address_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      piVar3 = &local_90;
      local_64.sa_family = 10;
      af = 10;
      uVar7 = local_88.ipv6_address_.addr_.__in6_u._0_8_;
    }
    *piVar3 = (in_addr_t)local_88.ipv6_address_.scope_id_._0_4_;
    local_64.sa_data[2] = (undefined1)local_8c;
    local_64.sa_data[3] = local_8c._1_1_;
    local_64.sa_data[4] = local_8c._2_1_;
    local_64.sa_data[5] = local_8c._3_1_;
    local_64.sa_data._6_2_ = SUB82(uVar7,0);
    local_64.sa_data._8_2_ = SUB82((ulong)uVar7 >> 0x10,0);
    local_64.sa_data._10_4_ = SUB84((ulong)uVar7 >> 0x20,0);
    uStack_54 = (undefined2)local_88.ipv6_address_.addr_.__in6_u._8_8_;
    uStack_52 = (undefined2)((ulong)local_88.ipv6_address_.addr_.__in6_u._8_8_ >> 0x10);
    uStack_50 = (undefined4)((ulong)local_88.ipv6_address_.addr_.__in6_u._8_8_ >> 0x20);
    local_4c = local_90;
    pbVar5 = (this_00->_M_t).
             super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
             .
             super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
             ._M_head_impl;
  }
  local_64.sa_data[0] = '\0';
  local_64.sa_data[1] = '\0';
  eVar8 = asio::detail::reactive_socket_service_base::do_open
                    ((reactive_socket_service_base *)
                     ((long)(pbVar5->
                            super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                            ).
                            super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                            .service_ + 0x28),
                     &(pbVar5->
                      super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                      ).super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
                      implementation_.super_base_implementation_type,af,2,0x11,&local_a0);
  if (eVar8._M_value == 0) {
    ((protocol_type *)
    ((long)&(pbVar5->
            super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
            super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
            implementation_ + 0x10))->family_ = af;
  }
  if (local_a0._M_value == 0) {
    pbVar5 = (this_00->_M_t).
             super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
             .
             super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
             ._M_head_impl;
    local_88.type_ = 1;
    asio::detail::reactive_socket_service<asio::ip::udp>::
    set_option<asio::detail::socket_option::boolean<1,2>>
              ((reactive_socket_service<asio::ip::udp> *)
               (*(long *)&(pbVar5->
                          super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                          ).
                          super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
               + 0x28),(implementation_type *)
                       ((long)&(pbVar5->
                               super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                               ).
                               super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                       + 8),(boolean<1,_2> *)&local_88,&local_a0);
    if (local_a0._M_value == 0) {
      pbVar5 = (this_00->_M_t).
               super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
               .
               super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
               ._M_head_impl;
      asio::detail::reactive_socket_service<asio::ip::udp>::bind
                ((reactive_socket_service<asio::ip::udp> *)
                 (*(long *)&(pbVar5->
                            super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                            ).
                            super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                 + 0x28),(int)pbVar5 + 8,&local_64,(socklen_t)&local_a0);
      if (local_a0._M_value == 0) {
        PostNextRead_UDP(in_RSI);
        this->State = (StateMachine *)0x0;
        return (Result)(ErrorResult *)this;
      }
      (**(code **)(*(long *)local_a0._M_cat + 0x20))(&local_88);
      lVar6 = (long)local_a0._M_value;
      pSVar2 = (StateMachine *)operator_new(0x38);
      pSVar2->Host = (AsioHost *)"UDP bind failed";
      pSVar2->SSDP = (SSDPRequester *)((long)&(pSVar2->API_Lock).super___mutex_base._M_mutex + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pSVar2->SSDP,local_88._0_8_,
                 (type_info *)(local_88._0_8_ + local_88.ipv6_address_.addr_.__in6_u._0_8_));
    }
    else {
      (**(code **)(*(long *)local_a0._M_cat + 0x20))(&local_88);
      lVar6 = (long)local_a0._M_value;
      pSVar2 = (StateMachine *)operator_new(0x38);
      pSVar2->Host = (AsioHost *)"UDP socket set_option reuse_address failed";
      pSVar2->SSDP = (SSDPRequester *)((long)&(pSVar2->API_Lock).super___mutex_base._M_mutex + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pSVar2->SSDP,local_88._0_8_,
                 (type_info *)(local_88._0_8_ + local_88.ipv6_address_.addr_.__in6_u._0_8_));
    }
  }
  else {
    (**(code **)(*(long *)local_a0._M_cat + 0x20))(&local_88);
    lVar6 = (long)local_a0._M_value;
    pSVar2 = (StateMachine *)operator_new(0x38);
    pSVar2->Host = (AsioHost *)"UDP socket open failed";
    pSVar2->SSDP = (SSDPRequester *)((long)&(pSVar2->API_Lock).super___mutex_base._M_mutex + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pSVar2->SSDP,local_88._0_8_,
               (type_info *)(local_88._0_8_ + local_88.ipv6_address_.addr_.__in6_u._0_8_));
  }
  *(undefined4 *)((long)&(pSVar2->API_Lock).super___mutex_base._M_mutex + 0x18) = 2;
  *(long *)((long)&(pSVar2->API_Lock).super___mutex_base._M_mutex + 0x20) = lVar6;
  this->State = pSVar2;
  puVar4 = (undefined8 *)((long)local_88.ipv6_address_.addr_.__in6_u.__u6_addr8 + 8);
LAB_00158fbb:
  if ((undefined8 *)puVar4[-2] != puVar4) {
    operator_delete((undefined8 *)puVar4[-2]);
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SSDPRequester::InitializeSockets()
{
    asio::error_code ec;

    Socket_UDP = MakeUniqueNoThrow<asio::ip::udp::socket>(*Host->Context);
    if (!Socket_UDP) {
        return Result::OutOfMemory();
    }

    UDPAddress bindAddress;

    // If application specified an interface address:
    if (State->InterfaceAddress.empty()) {
        // Note: Asio default endpoint address is the any address e.g. INADDR_ANY
        bindAddress = UDPAddress(asio::ip::udp::v4(), 0);
    }
    else
    {
        // Convert provided interface address to Asio address
        const asio::ip::address bindAddr = asio::ip::make_address(State->InterfaceAddress, ec);
        if (ec) {
            return Result("Provided InterfaceAddress was invalid", ec.message(), ErrorType::Asio, ec.value());
        }

        // Bind to the provided interface address
        bindAddress = UDPAddress(bindAddr, 0);
    }

    Socket_UDP->open(bindAddress.protocol(), ec);
    if (ec) {
        return Result("UDP socket open failed", ec.message(), ErrorType::Asio, ec.value());
    }
    Socket_UDP->set_option(asio::socket_base::reuse_address(true), ec);
    if (ec) {
        return Result("UDP socket set_option reuse_address failed", ec.message(), ErrorType::Asio, ec.value());
    }
    Socket_UDP->bind(bindAddress, ec);
    if (ec) {
        return Result("UDP bind failed", ec.message(), ErrorType::Asio, ec.value());
    }

    // Start listening
    PostNextRead_UDP();

    return Result::Success();
}